

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O3

Clause * __thiscall
Inferences::DuplicateLiteralRemovalISE::simplify(DuplicateLiteralRemovalISE *this,Clause *c)

{
  Literal *pLVar1;
  Literal *pLVar2;
  bool bVar3;
  Clause *pCVar4;
  Literal **ppLVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  int iVar10;
  long lVar11;
  Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> resLits;
  Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_80;
  SimplifyingInference1 local_70;
  Inference local_60;
  
  uVar6 = *(uint *)&c->field_0x38 & 0xfffff;
  uVar8 = (ulong)uVar6;
  if (uVar6 < 2) {
    return c;
  }
  if (simplify(Kernel::Clause*)::skipped == '\0') {
    simplify();
  }
  simplify::skipped._cursor = simplify::skipped._stack;
  if (uVar6 == 3) {
    pLVar1 = c->_literals[0];
    if (pLVar1 == *(Literal **)&c[1].super_Unit) {
      if (simplify::skipped._stack == simplify::skipped._end) {
        Lib::Stack<Kernel::Literal_*>::expand(&simplify::skipped);
      }
      *simplify::skipped._cursor = pLVar1;
      simplify::skipped._cursor = simplify::skipped._cursor + 1;
      pLVar1 = c->_literals[0];
      if (pLVar1 != *(Literal **)&c[1].super_Unit._inference) goto LAB_004eb73d;
      if (simplify::skipped._cursor == simplify::skipped._end) {
        Lib::Stack<Kernel::Literal_*>::expand(&simplify::skipped);
      }
      *simplify::skipped._cursor = pLVar1;
    }
    else {
      pLVar2 = *(Literal **)&c[1].super_Unit._inference;
      if (pLVar1 != pLVar2 && *(Literal **)&c[1].super_Unit != pLVar2) {
        simplify::skipped._cursor = simplify::skipped._stack;
        return c;
      }
      if (simplify::skipped._stack == simplify::skipped._end) {
        Lib::Stack<Kernel::Literal_*>::expand(&simplify::skipped);
      }
      *simplify::skipped._cursor = pLVar2;
    }
  }
  else {
    if (uVar6 != 2) {
      if (simplify(Kernel::Clause*)::seen == '\0') {
        simplify();
      }
      Lib::DHMap<Kernel::Literal_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
                (&simplify::seen._map);
      uVar7 = *(uint *)&c->field_0x38 & 0xfffff;
      if (uVar7 != 0) {
        lVar11 = 0;
        do {
          pLVar1 = c->_literals[lVar11];
          bVar3 = Lib::
                  DHMap<Kernel::Literal_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
                  insert(&simplify::seen._map,pLVar1);
          if (!bVar3) {
            if (simplify::skipped._cursor == simplify::skipped._end) {
              Lib::Stack<Kernel::Literal_*>::expand(&simplify::skipped);
            }
            *simplify::skipped._cursor = pLVar1;
            simplify::skipped._cursor = simplify::skipped._cursor + 1;
          }
          lVar11 = lVar11 + 1;
        } while ((uint)lVar11 < uVar7);
      }
      if (simplify::skipped._cursor == simplify::skipped._stack) {
        return c;
      }
      goto LAB_004eb73d;
    }
    pLVar1 = c->_literals[0];
    if (pLVar1 != *(Literal **)&c[1].super_Unit) {
      simplify::skipped._cursor = simplify::skipped._stack;
      return c;
    }
    if (simplify::skipped._stack == simplify::skipped._end) {
      Lib::Stack<Kernel::Literal_*>::expand(&simplify::skipped);
    }
    *simplify::skipped._cursor = pLVar1;
  }
  simplify::skipped._cursor = simplify::skipped._cursor + 1;
LAB_004eb73d:
  iVar10 = (int)((ulong)((long)simplify::skipped._cursor - (long)simplify::skipped._stack) >> 3);
  uVar6 = uVar6 - iVar10;
  Lib::Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_80);
  Lib::DArray<Kernel::Literal_*>::ensure
            ((DArray<Kernel::Literal_*> *)
             local_80._self._M_t.
             super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
             .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl,
             (long)(int)uVar6);
  sVar9 = (long)(int)uVar6;
  if (0 < (int)uVar6) {
    do {
      uVar7 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar7;
      if (simplify::skipped._cursor != simplify::skipped._stack) {
        uVar8 = (ulong)(int)uVar7;
        do {
          ppLVar5 = simplify::skipped._cursor + -1;
          if (c->_literals[uVar8] != *ppLVar5) break;
          uVar8 = uVar8 - 1;
          simplify::skipped._cursor = ppLVar5;
        } while (ppLVar5 != simplify::skipped._stack);
      }
      (*(Literal ***)
        ((long)local_80._self._M_t.
               super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10))
      [sVar9 - 1] = c->_literals[(int)uVar8];
      bVar3 = 1 < (long)sVar9;
      sVar9 = sVar9 - 1;
    } while (bVar3);
  }
  *(int *)(DAT_00b521c0 + 0x138) = *(int *)(DAT_00b521c0 + 0x138) + iVar10;
  ppLVar5 = *(Literal ***)
             ((long)local_80._self._M_t.
                    super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl +
             0x10);
  local_70.rule = REMOVE_DUPLICATE_LITERALS;
  local_70.premise = c;
  Kernel::Inference::Inference(&local_60,&local_70);
  pCVar4 = Kernel::Clause::fromArray(ppLVar5,uVar6,&local_60);
  Lib::Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_80);
  return pCVar4;
}

Assistant:

Clause* DuplicateLiteralRemovalISE::simplify(Clause* c)
{
  int length = c->length();
  if (length <= 1) {
    return c;
  }

  //literals that will be skipped, skipping starts on the top of the stack
  //and goes from the end of the clause
  static LiteralStack skipped;
  skipped.reset();

  //we handle low length specially, not to have to use the set
  if(length==2) {
    if((*c)[0]!=(*c)[1]) {
      return c;
    }
    skipped.push((*c)[0]);
  }
  else if(length==3) {
    if((*c)[0]!=(*c)[1]) {
      if((*c)[0]!=(*c)[2]) {
        if((*c)[1]!=(*c)[2]) {
          return c;
        }
      }
      skipped.push((*c)[2]);
    }
    else { //(*c)[0]==(*c)[1]
      skipped.push((*c)[0]);
      if((*c)[0]==(*c)[2]) {
        //all are equal
        skipped.push((*c)[0]);
      }
    }
  }
  else {
    static DHSet<Literal*> seen;
    seen.reset();
    //here we rely on the fact that the iterator traverses the clause from
    //the first to the last literal
    for (Literal* lit : c->iterLits()) {
      if(!seen.insert(lit)) {
        skipped.push(lit);
      }
    }
    if(skipped.isEmpty()) {
      return c;
    }
  }

  ASS(skipped.isNonEmpty());

  // there are duplicate literals, delete them from lits
  int newLength = length - skipped.length();
  // now lits[0 ... newLength-1] contain the remaining literals
  Recycled<DArray<Literal*>> resLits;
  resLits->ensure(newLength);

  int origIdx = length-1;

  for(int newIdx=newLength-1; newIdx>=0; newIdx--,origIdx--) {
    while(skipped.isNonEmpty() && (*c)[origIdx]==skipped.top()) {
      skipped.pop();
      origIdx--;
      ASS_GE(origIdx,0);
    }
    (*resLits)[newIdx] = (*c)[origIdx];
  }
  ASS(skipped.isEmpty());
  ASS_EQ(origIdx,-1);
  env.statistics->duplicateLiterals += length - newLength;

#if DEBUG_DUPLICATE_LITERALS
  {
    static DHSet<Literal*> origLits;
    origLits.reset();
    static DHSet<Literal*> newLits;
    newLits.reset();
    origLits.loadFromIterator(c->iterLits());
    newLits.loadFromIterator(d->iterLits());
    ASS_EQ(origLits.size(),newLits.size());
    ASS_EQ(origLits.size(), static_cast<unsigned>(newLength));
  }
#endif

  return Clause::fromArray(resLits->begin(), newLength,
			 SimplifyingInference1(InferenceRule::REMOVE_DUPLICATE_LITERALS,c));
}